

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleUsage.cpp
# Opt level: O3

void readmeExample2(void)

{
  long *plVar1;
  basic_ifstream<char,_std::char_traits<char>_> *stream;
  int iVar2;
  GeneratorBuilder<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
  local_dd0 [2];
  ifstream local_dc0 [8];
  ifstream local_db8 [512];
  istream_type *local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined4 local_b98;
  char local_b94;
  ulong local_b90;
  ulong uStack_b88;
  ulong uStack_b80;
  undefined1 local_b78;
  undefined1 local_b58 [520];
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_950;
  istream_type *local_940;
  undefined4 local_938;
  char local_934;
  ulong local_928;
  ulong uStack_920;
  undefined1 local_918;
  Generator<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:231:17)>
  local_908;
  ifstream local_6b0 [520];
  istream_type *local_4a8;
  undefined4 local_4a0;
  undefined1 local_49c;
  istream_type *local_498;
  undefined4 local_490;
  char local_48c;
  ulong local_480;
  ulong uStack_478;
  undefined1 local_470;
  Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
  local_468;
  LazyCode local_238 [520];
  
  std::ifstream::ifstream(local_238,"test.txt",_S_in);
  LazyCode::read<int,std::ifstream>(&local_468,local_238,stream);
  local_dd0[0].build.n = (anon_class_8_1_54a3980e_for_build)10;
  LazyCode::
  operator|<LazyCode::Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:225:26)>
            (&local_908,&local_468,local_dd0);
  std::ifstream::ifstream(local_dc0,(ifstream *)&local_908.member);
  local_bb8 = local_908.member.member.first._M_stream;
  local_bb0._0_5_ =
       CONCAT14(local_908.member.member.first._M_ok,local_908.member.member.first._M_value);
  local_ba8 = local_908.member.member.last._M_stream;
  local_ba0._0_5_ =
       CONCAT14(local_908.member.member.last._M_ok,local_908.member.member.last._M_value);
  local_b90 = local_908.producer.count;
  uStack_b88 = local_908.producer.n;
  std::ifstream::ifstream(local_6b0,local_dc0);
  local_4a8 = local_bb8;
  local_4a0 = (undefined4)local_bb0;
  local_49c = local_bb0._4_1_;
  local_498 = local_ba8;
  local_490 = (undefined4)local_ba0;
  local_48c = local_ba0._4_1_;
  local_480 = local_b90;
  uStack_478 = uStack_b88;
  std::ifstream::~ifstream(local_dc0);
  std::ifstream::ifstream(local_db8,local_6b0);
  local_bb0 = local_4a8;
  local_ba8._0_5_ = CONCAT14(local_49c,local_4a0);
  local_ba0 = local_498;
  local_b98 = local_490;
  local_b94 = local_48c;
  uStack_b88 = local_480;
  uStack_b80 = uStack_478;
  local_b78 = local_470;
  std::ifstream::ifstream(local_b58,local_db8);
  local_950._M_stream = local_bb0;
  local_950._M_value = (uint)local_ba8;
  local_950._M_ok = (bool)local_ba8._4_1_;
  local_940 = local_ba0;
  local_938 = local_b98;
  local_934 = local_b94;
  local_928 = uStack_b88;
  uStack_920 = uStack_b80;
  local_918 = local_b78;
  std::ifstream::~ifstream(local_db8);
  iVar2 = 0;
  while ((local_928 < uStack_920 &&
         ((local_950._M_ok != (bool)local_934 ||
          ((local_950._M_ok != false && (local_950._M_stream != local_940))))))) {
    local_928 = local_928 + 1;
    std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(&local_950);
    if ((local_950._M_value & 1U) == 0) {
      iVar2 = iVar2 + local_950._M_value * local_950._M_value;
    }
  }
  local_928 = local_928 + 1;
  std::ifstream::~ifstream(local_b58);
  std::ifstream::~ifstream(local_6b0);
  std::ifstream::~ifstream(&local_908.member);
  std::ifstream::~ifstream(&local_468);
  std::ifstream::~ifstream(local_238);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void readmeExample2() {
    int total = lz::read<int>(ifstream("test.txt")) | lz::limit(10) |
                lz::filter([](int i) { return i % 2 == 0; }) |
                lz::map([](int i) { return i * i; }) | lz::sum();

    cout << total << endl;
}